

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O3

void __thiscall QWidgetLineControl::del(QWidgetLineControl *this)

{
  int validateFromState;
  int iVar1;
  
  validateFromState = *(int *)(this + 0xf4);
  if ((*(long *)(this + 0x28) == 0) || (*(int *)(this + 0x114) <= *(int *)(this + 0x110))) {
    iVar1 = QTextLayout::nextCursorPosition((int)this + 0x118,*(CursorMode *)(this + 0x40));
    if (iVar1 != *(int *)(this + 0x40)) {
      iVar1 = *(int *)(this + 0x40) - iVar1;
      do {
        internalDelete(this,false);
        iVar1 = iVar1 + 1;
      } while (iVar1 != 0);
    }
  }
  else {
    removeSelectedText(this);
  }
  finishChange(this,validateFromState,false,true);
  return;
}

Assistant:

void QWidgetLineControl::del()
{
    int priorState = m_undoState;
    if (hasSelectedText()) {
        removeSelectedText();
    } else {
        int n = textLayout()->nextCursorPosition(m_cursor) - m_cursor;
        while (n--)
            internalDelete();
    }
    finishChange(priorState);
}